

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgCong.cpp
# Opt level: O1

ClauseIterator __thiscall Inferences::ArgCong::generateClauses(ArgCong *this,Clause *premise)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  _func_int **pp_Var5;
  Clause *in_RDX;
  
  uVar1 = *(ulong *)&in_RDX->field_0x38;
  if ((uVar1 & 0xfffff) == 0) {
    ::Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  else {
    lVar4 = (**(code **)(*(long *)&premise->super_Unit + 0x20))(premise);
    if (*(char *)(lVar4 + 0x1502) == '\x01') {
      (**(code **)(**(long **)(*(long *)&(premise->super_Unit)._inference + 200) + 0x10))();
    }
    uVar2 = *(undefined8 *)&in_RDX->field_0x38;
    uVar3 = Kernel::Clause::maxVar(in_RDX);
    pp_Var5 = (_func_int **)::operator_new(0x60,8);
    *(undefined4 *)(pp_Var5 + 1) = 0;
    *pp_Var5 = (_func_int *)&PTR__ProxyIterator_00b62c20;
    pp_Var5[3] = (_func_int *)in_RDX;
    pp_Var5[4] = (_func_int *)(CONCAT44(uVar3 + 1,(int)uVar2) & 0xffffffff000fffff);
    pp_Var5[6] = (_func_int *)in_RDX;
    pp_Var5[7] = (_func_int *)0x0;
    *(uint *)(pp_Var5 + 8) = (uint)(uVar1 >> 0x20) & 0xfffff;
    pp_Var5[9] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var5 + 10) = 0;
    (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
    super_InferenceEngine._vptr_InferenceEngine = pp_Var5;
    *(int *)(pp_Var5 + 1) = *(int *)(pp_Var5 + 1) + 1;
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator ArgCong::generateClauses(Clause* premise)
{
  //cout << "argcong with " + premise->toString() << endl;
  if(premise->isEmpty()) {
    return ClauseIterator::getEmpty();
  }
  ASS(premise->numSelected()>0);

  auto it1 = premise->getSelectedLiteralIterator();

  auto it2 = getFilteredIterator(it1,IsPositiveEqualityFn());

  auto it3 = getMappingIterator(it2,ResultFn(premise,
      getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete(),
      &_salg->getOrdering()));

  auto it4 = getFilteredIterator(it3,NonzeroFn());

  //cout << "out of arg cong" << endl;
  return pvi( it4 );
}